

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_LevelInit(void)

{
  size_t sVar1;
  char *name;
  
  sVar1 = FString::Len(&(level.info)->MapBackground);
  if (sVar1 == 0) {
    mapback = FTextureManager::CheckForTexture(&TexMan,"AUTOPAGE",8,1);
  }
  else {
    name = FString::operator_cast_to_char_(&(level.info)->MapBackground);
    mapback = FTextureManager::CheckForTexture(&TexMan,name,8,1);
  }
  AM_clearMarks();
  AM_findMinMaxBoundaries();
  scale_mtof = min_scale_mtof / 0.7;
  if (max_scale_mtof < scale_mtof) {
    scale_mtof = min_scale_mtof;
  }
  scale_ftom = 1.0 / scale_mtof;
  FBaseCVar::Callback(&am_showalllines.super_FBaseCVar);
  return;
}

Assistant:

void AM_LevelInit ()
{
	if (level.info->MapBackground.Len() == 0)
	{
		mapback = TexMan.CheckForTexture("AUTOPAGE", FTexture::TEX_MiscPatch);
	}
	else
	{
		mapback = TexMan.CheckForTexture(level.info->MapBackground, FTexture::TEX_MiscPatch);
	}

	AM_clearMarks();

	AM_findMinMaxBoundaries();
	scale_mtof = min_scale_mtof / 0.7;
	if (scale_mtof > max_scale_mtof)
		scale_mtof = min_scale_mtof;
	scale_ftom = 1 / scale_mtof;

	am_showalllines.Callback();
}